

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Level level;
  unsigned_long line;
  Logger *pLVar2;
  char *pcVar3;
  Writer *pWVar4;
  size_t sVar5;
  ostream *poVar6;
  undefined1 *puVar7;
  stringstream reasonStream;
  allocator local_27a;
  allocator local_279;
  undefined1 local_278 [88];
  Logger *pLStack_220;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  _Alloc_hider local_1a8;
  size_type sStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  Logger *local_188;
  _Alloc_hider local_180;
  Logger *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  pointer local_160;
  Logger *pLStack_158;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  DispatchAction local_130;
  
  if (this->m_proceed == true) {
    level = this->m_level;
    std::__cxx11::string::string((string *)&local_1d8,this->m_file,&local_279);
    line = this->m_line;
    std::__cxx11::string::string((string *)&local_1f8,this->m_func,&local_27a);
    LogMessage::LogMessage
              ((LogMessage *)local_278,level,&local_1d8,line,&local_1f8,this->m_verboseLevel,
               this->m_logger);
    local_130 = this->m_dispatchAction;
    local_1b8[0] = true;
    local_1b8._8_2_ = local_278._0_2_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_278 + 0x18)) {
      local_198._8_8_ = local_278._32_8_;
      local_1a8._M_p = (pointer)&local_198;
    }
    else {
      local_1a8._M_p = (pointer)local_278._8_8_;
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_278 + 0x40);
    sStack_1a0 = local_278._16_8_;
    local_278._16_8_ = 0;
    local_278[0x18] = '\0';
    local_188 = (Logger *)local_278._40_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._48_8_ == paVar1) {
      local_170._8_8_ = local_278._72_8_;
      local_180._M_p = (pointer)&local_170;
    }
    else {
      local_180._M_p = (pointer)local_278._48_8_;
    }
    local_178 = (Logger *)local_278._56_8_;
    local_278._56_8_ = (Logger *)0x0;
    local_278[0x40] = '\0';
    local_160 = (pointer)local_278._80_8_;
    pLStack_158 = pLStack_220;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_p == &local_208) {
      local_140._8_8_ = local_208._8_8_;
      local_150._M_p = (pointer)&local_140;
    }
    else {
      local_150._M_p = local_218._M_p;
    }
    local_148 = local_210;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_278._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_278 + 0x18);
    local_278._48_8_ = paVar1;
    local_218._M_p = (pointer)&local_208;
    LogDispatcher::dispatch((LogDispatcher *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_p != &local_208) {
      operator_delete(local_218._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._48_8_ != paVar1) {
      operator_delete((void *)local_278._48_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_278 + 0x18)) {
      operator_delete((void *)local_278._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  pLVar2 = this->m_logger;
  if (pLVar2 != (Logger *)0x0) {
    local_1b8._0_8_ = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    std::__cxx11::stringbuf::str((string *)&pLVar2->field_0x58);
    if ((_Alloc_hider *)local_1b8._0_8_ != &local_1a8) {
      operator_delete((void *)local_1b8._0_8_);
    }
    (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
  }
  if (((this->m_proceed == true) && (this->m_level == Fatal)) &&
     ((*(byte *)(elStorage + 0x20) & 8) == 0)) {
    local_1a8._M_p = this->m_file;
    sStack_1a0 = this->m_line;
    local_198._M_allocated_capacity = (size_type)this->m_func;
    local_1b8._0_8_ = &PTR__Writer_00129900;
    local_1b8._8_2_ = Warning;
    local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
    local_180._M_p = local_180._M_p & 0xffffffffffffff00;
    local_178 = (Logger *)0x0;
    local_170._M_allocated_capacity = (long)"\n" + 1;
    local_170._8_2_ = 2;
    local_160 = (pointer)0x0;
    pLStack_158 = (Logger *)0x0;
    local_150._M_p = (pointer)0x0;
    pWVar4 = construct((Writer *)local_1b8,1,"default");
    if (pWVar4->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50,
                 "Aborting application. Reason: Fatal log at [",0x2c);
      if ((*(byte *)(elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if (pWVar4->m_proceed == true) {
      pcVar3 = this->m_file;
      puVar7 = &((pWVar4->m_messageBuilder).m_logger)->field_0x50;
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)puVar7 + (int)*(undefined8 *)(*(long *)puVar7 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar7,pcVar3,sVar5);
      }
      if ((*(byte *)(elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if (pWVar4->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50,":",1);
      if ((*(byte *)(elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if (pWVar4->m_proceed == true) {
      std::ostream::_M_insert<unsigned_long>
                ((ulong)&((pWVar4->m_messageBuilder).m_logger)->field_0x50);
      if ((*(byte *)(elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if (pWVar4->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50,"]",1);
      if ((*(byte *)(elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar4->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    ~Writer((Writer *)local_1b8);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Fatal log at [",0xe);
    pcVar3 = this->m_file;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)(ostream *)&local_1a8 + (int)*(undefined8 *)(local_1a8._M_p + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," If you wish to disable \'abort on fatal log\' please use ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)",
               0x48);
    std::__cxx11::stringbuf::str();
    abort();
  }
  this->m_proceed = false;
  return;
}

Assistant:

void triggerDispatch(void) {
        if (m_proceed) {
            base::LogDispatcher(m_proceed, LogMessage(m_level, m_file, m_line, m_func, m_verboseLevel,
                          m_logger), m_dispatchAction).dispatch();
        }
        if (m_logger != nullptr) {
            m_logger->stream().str(ELPP_LITERAL(""));
            m_logger->releaseLock();
        }
        if (m_proceed && m_level == Level::Fatal
                && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
            base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
                    << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
            std::stringstream reasonStream;
            reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                << " If you wish to disable 'abort on fatal log' please use "
                << "el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
            base::utils::abort(1, reasonStream.str());
        }
        m_proceed = false;
    }